

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonParse *pParse;
  JsonNode *pNode_00;
  int local_c4;
  undefined1 local_c0 [4];
  int i;
  JsonString jx;
  char *zPath;
  JsonNode *pNode;
  JsonParse *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  if ((1 < argc) && (pParse = jsonParseCached(ctx,argv,ctx), pParse != (JsonParse *)0x0)) {
    jsonInit((JsonString *)local_c0,ctx);
    jsonAppendChar((JsonString *)local_c0,'[');
    for (local_c4 = 1; local_c4 < argc; local_c4 = local_c4 + 1) {
      jx._128_8_ = sqlite3_value_text(argv[local_c4]);
      pNode_00 = jsonLookup(pParse,(char *)jx._128_8_,(int *)0x0,ctx);
      if (pParse->nErr != '\0') break;
      if (argc < 3) {
        if (pNode_00 != (JsonNode *)0x0) {
          jsonReturn(pNode_00,ctx,(sqlite3_value **)0x0);
        }
      }
      else {
        jsonAppendSeparator((JsonString *)local_c0);
        if (pNode_00 == (JsonNode *)0x0) {
          jsonAppendRaw((JsonString *)local_c0,"null",4);
        }
        else {
          jsonRenderNode(pNode_00,(JsonString *)local_c0,(sqlite3_value **)0x0);
        }
      }
    }
    if ((2 < argc) && (local_c4 == argc)) {
      jsonAppendChar((JsonString *)local_c0,']');
      jsonResult((JsonString *)local_c0);
      sqlite3_result_subtype(ctx,0x4a);
    }
    jsonReset((JsonString *)local_c0);
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  JsonString jx;
  int i;

  if( argc<2 ) return;
  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '[');
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    pNode = jsonLookup(p, zPath, 0, ctx);
    if( p->nErr ) break;
    if( argc>2 ){
      jsonAppendSeparator(&jx);
      if( pNode ){
        jsonRenderNode(pNode, &jx, 0);
      }else{
        jsonAppendRaw(&jx, "null", 4);
      }
    }else if( pNode ){
      jsonReturn(pNode, ctx, 0);
    }
  }
  if( argc>2 && i==argc ){
    jsonAppendChar(&jx, ']');
    jsonResult(&jx);
    sqlite3_result_subtype(ctx, JSON_SUBTYPE);
  }
  jsonReset(&jx);
}